

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_helper.cpp
# Opt level: O3

string * __thiscall
duckdb::TestResultHelper::SQLLogicTestConvertValue_abi_cxx11_
          (string *__return_storage_ptr__,TestResultHelper *this,Value *value,LogicalType *sql_type,
          bool original_sqlite_test)

{
  char cVar1;
  pointer pCVar2;
  type pCVar3;
  char *pcVar4;
  char *pcVar5;
  string str;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  undefined2 *local_80;
  undefined8 local_78;
  undefined2 local_70 [24];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (value[0x18] == (Value)0x1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "NULL";
    pcVar4 = "";
  }
  else {
    if ((byte)((char)*sql_type - 0x15U) < 3 && original_sqlite_test) {
      pCVar2 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
               operator->(&this->runner->con);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)pCVar2);
      duckdb::LogicalType::LogicalType((LogicalType *)&local_a0,BIGINT);
      duckdb::Value::CastAs((ClientContext *)&local_80,(LogicalType *)value,SUB81(pCVar3,0));
      duckdb::Value::ToString_abi_cxx11_();
      duckdb::Value::~Value((Value *)&local_80);
      duckdb::LogicalType::~LogicalType((LogicalType *)&local_a0);
      return __return_storage_ptr__;
    }
    if (*sql_type != (LogicalType)0xa) {
      pCVar2 = unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
               operator->(&this->runner->con);
      pCVar3 = shared_ptr<duckdb::ClientContext,_true>::operator*
                         ((shared_ptr<duckdb::ClientContext,_true> *)pCVar2);
      duckdb::LogicalType::LogicalType((LogicalType *)local_c0,VARCHAR);
      duckdb::Value::CastAs((ClientContext *)&local_80,(LogicalType *)value,SUB81(pCVar3,0));
      duckdb::Value::ToString_abi_cxx11_();
      duckdb::Value::~Value((Value *)&local_80);
      duckdb::LogicalType::~LogicalType((LogicalType *)local_c0);
      if (local_98 == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"(empty)","");
      }
      else {
        local_40[0] = local_30;
        std::__cxx11::string::_M_construct<char*>((string *)local_40,local_a0,local_a0 + local_98);
        local_70[0] = 0;
        local_78 = 1;
        local_c0[0] = local_b0;
        local_80 = local_70;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"\\0","");
        duckdb::StringUtil::Replace(__return_storage_ptr__,local_40,&local_80,local_c0);
        if (local_c0[0] != local_b0) {
          operator_delete(local_c0[0]);
        }
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if (local_40[0] != local_30) {
          operator_delete(local_40[0]);
        }
      }
      if (local_a0 == local_90) {
        return __return_storage_ptr__;
      }
      operator_delete(local_a0);
      return __return_storage_ptr__;
    }
    cVar1 = duckdb::BooleanValue::Get(value);
    pcVar5 = "0";
    if (cVar1 != '\0') {
      pcVar5 = "1";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    if (cVar1 != '\0') {
      pcVar4 = "";
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

string TestResultHelper::SQLLogicTestConvertValue(Value value, LogicalType sql_type, bool original_sqlite_test) {
	if (value.IsNull()) {
		return "NULL";
	} else {
		if (original_sqlite_test) {
			// sqlite test hashes want us to convert floating point numbers to integers
			switch (sql_type.id()) {
			case LogicalTypeId::DECIMAL:
			case LogicalTypeId::FLOAT:
			case LogicalTypeId::DOUBLE:
				return value.CastAs(*runner.con->context, LogicalType::BIGINT).ToString();
			default:
				break;
			}
		}
		switch (sql_type.id()) {
		case LogicalTypeId::BOOLEAN:
			return BooleanValue::Get(value) ? "1" : "0";
		default: {
			string str = value.CastAs(*runner.con->context, LogicalType::VARCHAR).ToString();
			if (str.empty()) {
				return "(empty)";
			} else {
				return StringUtil::Replace(str, string("\0", 1), "\\0");
			}
		}
		}
	}
}